

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  allocator<char> local_259;
  undefined1 local_258 [8];
  string m_2;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8 [8];
  string bspName;
  undefined1 local_1a0 [8];
  string m_1;
  string local_178;
  allocator<char> local_151;
  undefined1 local_150 [8];
  string m;
  string local_128;
  undefined1 local_108 [8];
  string osdir;
  string local_e0;
  string local_c0 [8];
  string platform;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string arch;
  cmMakefile *mf_local;
  string *p_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  arch.field_2._8_8_ = mf;
  std::__cxx11::string::string((string *)local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=((string *)local_40,(string *)p);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "Green Hills MULTI: -A <arch> not specified; defaulting to \"arm\"",&local_61);
    cmSystemTools::Message(&local_60,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    std::__cxx11::string::operator=((string *)local_40,"arm");
    uVar1 = arch.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_GENERATOR_PLATFORM",
               (allocator<char> *)(platform.field_2._M_local_buf + 0xf));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              ((cmMakefile *)uVar1,&local_98,pcVar5,"Name of generator platform.",INTERNAL,false);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)(platform.field_2._M_local_buf + 0xf));
  }
  uVar1 = arch.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"GHS_TARGET_PLATFORM",
             (allocator<char> *)(osdir.field_2._M_local_buf + 0xf));
  psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_e0);
  std::__cxx11::string::string(local_c0,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)(osdir.field_2._M_local_buf + 0xf));
  uVar1 = arch.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"GHS_OS_DIR",(allocator<char> *)(m.field_2._M_local_buf + 0xf));
  psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_128);
  std::__cxx11::string::string((string *)local_108,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)(m.field_2._M_local_buf + 0xf));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmSystemTools::IsOff(pcVar5);
  if ((bVar2) && (lVar6 = std::__cxx11::string::find((char *)local_c0,0x8aeed1), lVar6 != -1)) {
    bVar2 = cmake::GetIsInTryCompile((this->super_cmGlobalGenerator).CMakeInstance);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_150,
                 "Green Hills MULTI: GHS_OS_DIR not specified; No OS found in \"",&local_151);
      std::allocator<char>::~allocator(&local_151);
      uVar1 = arch.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"GHS_OS_ROOT",
                 (allocator<char> *)(m_1.field_2._M_local_buf + 0xf));
      psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_178);
      std::__cxx11::string::operator+=((string *)local_150,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)(m_1.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)local_150,"\"");
      cmSystemTools::Message((string *)local_150,(char *)0x0);
      std::__cxx11::string::~string((string *)local_150);
    }
    std::__cxx11::string::operator=((string *)local_108,"GHS_OS_DIR-NOT-SPECIFIED");
  }
  else {
    bVar2 = cmake::GetIsInTryCompile((this->super_cmGlobalGenerator).CMakeInstance);
    if (((!bVar2) && (bVar2 = cmSystemTools::IsOff(&this->OsDir), bVar2)) &&
       (bVar2 = cmSystemTools::IsOff((string *)local_108), !bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a0,"Green Hills MULTI: GHS_OS_DIR not specified; found \"",
                 (allocator<char> *)(bspName.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(bspName.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)local_1a0,(string *)local_108);
      std::__cxx11::string::operator+=((string *)local_1a0,"\"");
      cmSystemTools::Message((string *)local_1a0,(char *)0x0);
      std::__cxx11::string::~string((string *)local_1a0);
    }
  }
  std::__cxx11::string::operator=((string *)&this->OsDir,(string *)local_108);
  uVar1 = arch.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"GHS_BSP_NAME",&local_1e9)
  ;
  psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_1e8);
  std::__cxx11::string::string(local_1c8,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmSystemTools::IsOff(pcVar5);
  if ((bVar2) && (lVar6 = std::__cxx11::string::find((char *)local_c0,0x8aeed1), lVar6 != -1)) {
    std::operator+(&local_210,"sim",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::operator=(local_1c8,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    uVar1 = arch.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"GHS_BSP_NAME",
               (allocator<char> *)(m_2.field_2._M_local_buf + 0xf));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              ((cmMakefile *)uVar1,&local_230,pcVar5,"Name of GHS target platform.",STRING,true);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)(m_2.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_258,"Green Hills MULTI: GHS_BSP_NAME not specified; defaulting to \""
               ,&local_259);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::operator+=((string *)local_258,local_1c8);
    std::__cxx11::string::operator+=((string *)local_258,"\"");
    cmSystemTools::Message((string *)local_258,(char *)0x0);
    std::__cxx11::string::~string((string *)local_258);
  }
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)local_40);
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  std::string arch;
  if (p.empty()) {
    cmSystemTools::Message(
      "Green Hills MULTI: -A <arch> not specified; defaulting to \"arm\"");
    arch = "arm";

    /* store the platform name for later use
     * -- already done if -A<arch> was specified
     */
    mf->AddCacheDefinition("CMAKE_GENERATOR_PLATFORM", arch.c_str(),
                           "Name of generator platform.",
                           cmStateEnums::INTERNAL);
  } else {
    arch = p;
  }

  /* check if OS location has been updated by platform scripts */
  std::string platform = mf->GetSafeDefinition("GHS_TARGET_PLATFORM");
  std::string osdir = mf->GetSafeDefinition("GHS_OS_DIR");
  if (cmSystemTools::IsOff(osdir.c_str()) &&
      platform.find("integrity") != std::string::npos) {
    if (!this->CMakeInstance->GetIsInTryCompile()) {
      /* required OS location is not found */
      std::string m =
        "Green Hills MULTI: GHS_OS_DIR not specified; No OS found in \"";
      m += mf->GetSafeDefinition("GHS_OS_ROOT");
      m += "\"";
      cmSystemTools::Message(m);
    }
    osdir = "GHS_OS_DIR-NOT-SPECIFIED";
  } else if (!this->CMakeInstance->GetIsInTryCompile() &&
             cmSystemTools::IsOff(this->OsDir) &&
             !cmSystemTools::IsOff(osdir)) {
    /* OS location was updated by auto-selection */
    std::string m = "Green Hills MULTI: GHS_OS_DIR not specified; found \"";
    m += osdir;
    m += "\"";
    cmSystemTools::Message(m);
  }
  this->OsDir = osdir;

  // Determine GHS_BSP_NAME
  std::string bspName = mf->GetSafeDefinition("GHS_BSP_NAME");

  if (cmSystemTools::IsOff(bspName.c_str()) &&
      platform.find("integrity") != std::string::npos) {
    bspName = "sim" + arch;
    /* write back the calculate name for next time */
    mf->AddCacheDefinition("GHS_BSP_NAME", bspName.c_str(),
                           "Name of GHS target platform.",
                           cmStateEnums::STRING, true);
    std::string m =
      "Green Hills MULTI: GHS_BSP_NAME not specified; defaulting to \"";
    m += bspName;
    m += "\"";
    cmSystemTools::Message(m);
  }

  return true;
}